

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase4::Run(BasicAtomicCase4 *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lStackY_90;
  allocator<char> local_7a;
  allocator<char> local_79;
  GLuint udata [8];
  GLint idata [8];
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,2)
  ;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)udata,
               "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) buffer Counters {\n  uint g_uint_counter;\n  int g_int_counter;\n};\nlayout(std430, binding = 1) buffer Output {\n  uint udata[8];\n  int idata[8];\n} g_output;\nvoid main() {\n  gl_Position = g_in_position;\n  const uint uidx = atomicAdd(g_uint_counter, 1u);\n  const int iidx = atomicAdd(g_int_counter, -1);\n  g_output.udata[uidx] = uidx;\n  g_output.idata[iidx] = iidx;\n}"
               ,&local_79);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)idata,
               "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 0) buffer Counters {\n  uint g_uint_counter;\n  int g_int_counter;\n};\nlayout(std430, binding = 1) buffer Output {\n  uint udata[8];\n  int idata[8];\n} g_output;\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n  const uint uidx = atomicAdd(g_uint_counter, 1u);\n  const int iidx = atomicAdd(g_int_counter, -1);\n  g_output.udata[uidx] = uidx;\n  g_output.idata[iidx] = iidx;\n}"
               ,&local_7a);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)udata,(string *)idata);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)idata);
    std::__cxx11::string::~string((string *)udata);
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lStackY_90 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_storage_buffer);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,8,(void *)0x0,0x88e8);
      puVar3 = (undefined8 *)glu::CallLogWrapper::glMapBuffer(this_00,0x90d2,0x88b9);
      if (puVar3 != (undefined8 *)0x0) {
        *puVar3 = 0x700000000;
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x40,(void *)0x0,0x88e8);
        udata[4] = 0xbf4ccccd;
        udata[5] = 0x3f4ccccd;
        udata[6] = 0x3f4ccccd;
        udata[7] = 0x3f4ccccd;
        udata[0] = 0xbf4ccccd;
        udata[1] = 0xbf4ccccd;
        udata[2] = 0x3f4ccccd;
        udata[3] = 0xbf4ccccd;
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x8892,0x20,udata,0x88e4);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,2,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
        glu::CallLogWrapper::glDrawArrays(this_00,0,0,4);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x20,udata);
        for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
          if (uVar4 != udata[uVar4]) {
            anon_unknown_0::Output
                      ("uData at index %d is %d should be %d.\n",uVar4 & 0xffffffff,
                       (ulong)udata[uVar4],uVar4 & 0xffffffff);
            return -1;
          }
        }
        glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0x20,0x20,idata);
        lStackY_90 = 0;
        for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
          if (uVar4 != (uint)idata[uVar4]) {
            anon_unknown_0::Output
                      ("iData at index %d is %d should be %d.\n",uVar4 & 0xffffffff,
                       (ulong)(uint)idata[uVar4],uVar4 & 0xffffffff);
            return -(ulong)(uVar4 < 8);
          }
        }
      }
    }
  }
  else {
    lStackY_90 = 0x10;
  }
  return lStackY_90;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_in_position;" NL "layout(std430, binding = 0) buffer Counters {" NL
			   "  uint g_uint_counter;" NL "  int g_int_counter;" NL "};" NL
			   "layout(std430, binding = 1) buffer Output {" NL "  uint udata[8];" NL "  int idata[8];" NL
			   "} g_output;" NL "void main() {" NL "  gl_Position = g_in_position;" NL
			   "  const uint uidx = atomicAdd(g_uint_counter, 1u);" NL
			   "  const int iidx = atomicAdd(g_int_counter, -1);" NL "  g_output.udata[uidx] = uidx;" NL
			   "  g_output.idata[iidx] = iidx;" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "layout(std430, binding = 0) buffer Counters {" NL
			   "  uint g_uint_counter;" NL "  int g_int_counter;" NL "};" NL
			   "layout(std430, binding = 1) buffer Output {" NL "  uint udata[8];" NL "  int idata[8];" NL
			   "} g_output;" NL "void main() {" NL "  g_fs_out = vec4(0, 1, 0, 1);" NL
			   "  const uint uidx = atomicAdd(g_uint_counter, 1u);" NL
			   "  const int iidx = atomicAdd(g_int_counter, -1);" NL "  g_output.udata[uidx] = uidx;" NL
			   "  g_output.idata[iidx] = iidx;" NL "}";
		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_storage_buffer);
		/* counter buffer */
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 2 * sizeof(int), NULL, GL_DYNAMIC_DRAW);
			int* ptr = reinterpret_cast<int*>(glMapBuffer(GL_SHADER_STORAGE_BUFFER, GL_WRITE_ONLY));
			if (!ptr)
				return ERROR;
			*ptr++ = 0;
			*ptr++ = 7;
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* output buffer */
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * sizeof(int), NULL, GL_DYNAMIC_DRAW);
		}
		/* vertex buffer */
		{
			const float data[] = { -0.8f, -0.8f, 0.8f, -0.8f, -0.8f, 0.8f, 0.8f, 0.8f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		GLuint udata[8];
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(udata), udata);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (udata[i] != i)
			{
				Output("uData at index %d is %d should be %d.\n", i, udata[i], i);
				return ERROR;
			}
		}
		GLint idata[8];
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, sizeof(udata), sizeof(idata), idata);
		for (GLint i = 0; i < 8; ++i)
		{
			if (idata[i] != i)
			{
				Output("iData at index %d is %d should be %d.\n", i, idata[i], i);
				return ERROR;
			}
		}
		return NO_ERROR;
	}